

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_mesh * djgm_load_plane(int slices,int stacks)

{
  bool bVar1;
  djg_mesh *mesh;
  int stacks_local;
  int slices_local;
  
  _stacks_local = djgm__create();
  if (slices < 0 || stacks < 0) {
    __assert_fail("slices >= 0 && stacks >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x674,"djg_mesh *djgm_load_plane(int, int)");
  }
  bVar1 = djgm__load_plane_vertices(_stacks_local,slices,stacks);
  if (bVar1) {
    bVar1 = djgm__load_plane_polygons(_stacks_local,slices,stacks);
    if (!bVar1) {
      free(_stacks_local->vertexv);
      free(_stacks_local);
      _stacks_local = (djg_mesh *)0x0;
    }
  }
  else {
    free(_stacks_local);
    _stacks_local = (djg_mesh *)0x0;
  }
  return _stacks_local;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_plane(int slices, int stacks)
{
    djg_mesh *mesh = djgm__create();

    DJG_ASSERT(slices >= 0 && stacks >= 0);
    if (!djgm__load_plane_vertices(mesh, slices, stacks)) {
        DJG_FREE(mesh);

        return NULL;
    }
    if (!djgm__load_plane_polygons(mesh, slices, stacks)) {
        DJG_FREE(mesh->vertexv);
        DJG_FREE(mesh);

        return NULL;
    }

    return mesh;
}